

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderMaxInvocationsTest::deinit(GeometryShaderMaxInvocationsTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x1680))(0);
  (**(code **)(lVar2 + 0xd8))(0);
  (**(code **)(lVar2 + 0x6a0))(0x8ca9,0x8ce0,0xde1,0,0);
  (**(code **)(lVar2 + 0xb8))(0xde1,0);
  (**(code **)(lVar2 + 0x78))(0x8d40,0);
  if (this->m_program_object_id_for_multiple_invocations_pass != 0) {
    (**(code **)(lVar2 + 0x448))();
    this->m_program_object_id_for_multiple_invocations_pass = 0;
  }
  if (this->m_fragment_shader_id_for_multiple_invocations_pass != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_fragment_shader_id_for_multiple_invocations_pass = 0;
  }
  if (this->m_geometry_shader_id_for_multiple_invocations_pass != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_geometry_shader_id_for_multiple_invocations_pass = 0;
  }
  if (this->m_vertex_shader_id_for_multiple_invocations_pass != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_vertex_shader_id_for_multiple_invocations_pass = 0;
  }
  if (this->m_program_object_id_for_single_invocation_pass != 0) {
    (**(code **)(lVar2 + 0x448))();
    this->m_program_object_id_for_single_invocation_pass = 0;
  }
  if (this->m_fragment_shader_id_for_single_invocation_pass != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_fragment_shader_id_for_single_invocation_pass = 0;
  }
  if (this->m_geometry_shader_id_for_single_invocation_pass != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_geometry_shader_id_for_single_invocation_pass = 0;
  }
  if (this->m_vertex_shader_id_for_single_invocation_pass != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_vertex_shader_id_for_single_invocation_pass = 0;
  }
  if (this->m_vertex_array_object_id != 0) {
    (**(code **)(lVar2 + 0x490))(1,&this->m_vertex_array_object_id);
    this->m_vertex_array_object_id = 0;
  }
  if (this->m_color_texture_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_color_texture_id);
    this->m_color_texture_id = 0;
  }
  if (this->m_framebuffer_object_id != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_framebuffer_object_id);
    this->m_framebuffer_object_id = 0;
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void GeometryShaderMaxInvocationsTest::deinit()
{
	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset OpenGL ES state */
	gl.useProgram(0);
	gl.bindVertexArray(0);
	gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0 /* texture */, 0 /* level */);
	gl.bindTexture(GL_TEXTURE_2D, 0);
	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);

	/* Delete everything */
	if (m_program_object_id_for_multiple_invocations_pass != 0)
	{
		gl.deleteProgram(m_program_object_id_for_multiple_invocations_pass);

		m_program_object_id_for_multiple_invocations_pass = 0;
	}

	if (m_fragment_shader_id_for_multiple_invocations_pass != 0)
	{
		gl.deleteShader(m_fragment_shader_id_for_multiple_invocations_pass);

		m_fragment_shader_id_for_multiple_invocations_pass = 0;
	}

	if (m_geometry_shader_id_for_multiple_invocations_pass != 0)
	{
		gl.deleteShader(m_geometry_shader_id_for_multiple_invocations_pass);

		m_geometry_shader_id_for_multiple_invocations_pass = 0;
	}

	if (m_vertex_shader_id_for_multiple_invocations_pass != 0)
	{
		gl.deleteShader(m_vertex_shader_id_for_multiple_invocations_pass);

		m_vertex_shader_id_for_multiple_invocations_pass = 0;
	}

	if (m_program_object_id_for_single_invocation_pass != 0)
	{
		gl.deleteProgram(m_program_object_id_for_single_invocation_pass);

		m_program_object_id_for_single_invocation_pass = 0;
	}

	if (m_fragment_shader_id_for_single_invocation_pass != 0)
	{
		gl.deleteShader(m_fragment_shader_id_for_single_invocation_pass);

		m_fragment_shader_id_for_single_invocation_pass = 0;
	}

	if (m_geometry_shader_id_for_single_invocation_pass != 0)
	{
		gl.deleteShader(m_geometry_shader_id_for_single_invocation_pass);

		m_geometry_shader_id_for_single_invocation_pass = 0;
	}

	if (m_vertex_shader_id_for_single_invocation_pass != 0)
	{
		gl.deleteShader(m_vertex_shader_id_for_single_invocation_pass);

		m_vertex_shader_id_for_single_invocation_pass = 0;
	}

	if (m_vertex_array_object_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vertex_array_object_id);

		m_vertex_array_object_id = 0;
	}

	if (m_color_texture_id != 0)
	{
		gl.deleteTextures(1, &m_color_texture_id);

		m_color_texture_id = 0;
	}

	if (m_framebuffer_object_id != 0)
	{
		gl.deleteFramebuffers(1, &m_framebuffer_object_id);

		m_framebuffer_object_id = 0;
	}

	/* Deinitilize base class */
	TestCaseBase::deinit();
}